

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIntersectWildcards
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaWildcardPtr completeWild,
              xmlSchemaWildcardPtr curWild)

{
  _xmlSchemaWildcardNs *p_Var1;
  bool bVar2;
  int iVar3;
  xmlChar *pxStack_58;
  int found_1;
  xmlChar *neg;
  int found;
  xmlSchemaWildcardNsPtr tmp;
  xmlSchemaWildcardNsPtr prev;
  xmlSchemaWildcardNsPtr curB;
  xmlSchemaWildcardNsPtr cur;
  xmlSchemaWildcardPtr curWild_local;
  xmlSchemaWildcardPtr completeWild_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((((completeWild->any == curWild->any) &&
       ((completeWild->nsSet == (xmlSchemaWildcardNsPtr)0x0) ==
        (curWild->nsSet == (xmlSchemaWildcardNsPtr)0x0))) &&
      ((completeWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0) ==
       (curWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0))) &&
     ((completeWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0 ||
      (completeWild->negNsSet->value == curWild->negNsSet->value)))) {
    if (completeWild->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
      return 0;
    }
    bVar2 = false;
    for (curB = completeWild->nsSet; curB != (xmlSchemaWildcardNsPtr)0x0; curB = curB->next) {
      bVar2 = false;
      for (prev = curWild->nsSet; prev != (xmlSchemaWildcardNsPtr)0x0; prev = prev->next) {
        if (curB->value == prev->value) {
          bVar2 = true;
          break;
        }
      }
      if (!bVar2) break;
    }
    if (bVar2) {
      return 0;
    }
  }
  if ((completeWild->any == curWild->any) || (completeWild->any == 0)) {
    if (((completeWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0) ||
        (curWild->nsSet == (xmlSchemaWildcardNsPtr)0x0)) &&
       ((curWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0 ||
        (completeWild->nsSet == (xmlSchemaWildcardNsPtr)0x0)))) {
      if ((completeWild->nsSet == (xmlSchemaWildcardNsPtr)0x0) ||
         (curWild->nsSet == (xmlSchemaWildcardNsPtr)0x0)) {
        if ((completeWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0) ||
           ((((curWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0 ||
              (completeWild->negNsSet->value == curWild->negNsSet->value)) ||
             (completeWild->negNsSet->value == (xmlChar *)0x0)) ||
            (curWild->negNsSet->value == (xmlChar *)0x0)))) {
          if ((((completeWild->negNsSet != (xmlSchemaWildcardNsPtr)0x0) &&
               (curWild->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) &&
              (completeWild->negNsSet->value != curWild->negNsSet->value)) &&
             (completeWild->negNsSet->value == (xmlChar *)0x0)) {
            completeWild->negNsSet->value = curWild->negNsSet->value;
          }
          ctxt_local._4_4_ = 0;
        }
        else {
          xmlSchemaPErr(ctxt,completeWild->node,0x701,
                        "The intersection of the wildcard is not expressible.\n",(xmlChar *)0x0,
                        (xmlChar *)0x0);
          ctxt_local._4_4_ = 0x701;
        }
      }
      else {
        tmp = (xmlSchemaWildcardNsPtr)0x0;
        curB = completeWild->nsSet;
        while (curB != (xmlSchemaWildcardNsPtr)0x0) {
          bVar2 = false;
          for (prev = curWild->nsSet; prev != (xmlSchemaWildcardNsPtr)0x0; prev = prev->next) {
            if (curB->value == prev->value) {
              bVar2 = true;
              break;
            }
          }
          if (bVar2) {
            tmp = curB;
            curB = curB->next;
          }
          else {
            if (tmp == (xmlSchemaWildcardNsPtr)0x0) {
              completeWild->nsSet = curB->next;
            }
            else {
              tmp->next = curB->next;
            }
            p_Var1 = curB->next;
            (*xmlFree)(curB);
            curB = p_Var1;
          }
        }
        ctxt_local._4_4_ = 0;
      }
    }
    else {
      if (completeWild->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
        pxStack_58 = completeWild->negNsSet->value;
        iVar3 = xmlSchemaCloneWildcardNsConstraints(ctxt,completeWild,curWild);
        if (iVar3 == -1) {
          return -1;
        }
      }
      else {
        pxStack_58 = curWild->negNsSet->value;
      }
      tmp = (xmlSchemaWildcardNsPtr)0x0;
      for (curB = completeWild->nsSet; curB != (xmlSchemaWildcardNsPtr)0x0; curB = curB->next) {
        if (curB->value == (xmlChar *)0x0) {
          if (tmp == (xmlSchemaWildcardNsPtr)0x0) {
            completeWild->nsSet = curB->next;
          }
          else {
            tmp->next = curB->next;
          }
          (*xmlFree)(curB);
          break;
        }
        tmp = curB;
      }
      if (pxStack_58 != (xmlChar *)0x0) {
        tmp = (xmlSchemaWildcardNsPtr)0x0;
        for (curB = completeWild->nsSet; curB != (xmlSchemaWildcardNsPtr)0x0; curB = curB->next) {
          if (curB->value == pxStack_58) {
            if (tmp == (xmlSchemaWildcardNsPtr)0x0) {
              completeWild->nsSet = curB->next;
            }
            else {
              tmp->next = curB->next;
            }
            (*xmlFree)(curB);
            break;
          }
          tmp = curB;
        }
      }
      ctxt_local._4_4_ = 0;
    }
  }
  else {
    iVar3 = xmlSchemaCloneWildcardNsConstraints(ctxt,completeWild,curWild);
    if (iVar3 == -1) {
      ctxt_local._4_4_ = -1;
    }
    else {
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaIntersectWildcards(xmlSchemaParserCtxtPtr ctxt,
			    xmlSchemaWildcardPtr completeWild,
			    xmlSchemaWildcardPtr curWild)
{
    xmlSchemaWildcardNsPtr cur, curB, prev,  tmp;

    /*
    * 1 If O1 and O2 are the same value, then that value must be the
    * value.
    */
    if ((completeWild->any == curWild->any) &&
	((completeWild->nsSet == NULL) == (curWild->nsSet == NULL)) &&
	((completeWild->negNsSet == NULL) == (curWild->negNsSet == NULL))) {

	if ((completeWild->negNsSet == NULL) ||
	    (completeWild->negNsSet->value == curWild->negNsSet->value)) {

	    if (completeWild->nsSet != NULL) {
		int found = 0;

		/*
		* Check equality of sets.
		*/
		cur = completeWild->nsSet;
		while (cur != NULL) {
		    found = 0;
		    curB = curWild->nsSet;
		    while (curB != NULL) {
			if (cur->value == curB->value) {
			    found = 1;
			    break;
			}
			curB = curB->next;
		    }
		    if (!found)
			break;
		    cur = cur->next;
		}
		if (found)
		    return(0);
	    } else
		return(0);
	}
    }
    /*
    * 2 If either O1 or O2 is any, then the other must be the value.
    */
    if ((completeWild->any != curWild->any) && (completeWild->any)) {
	if (xmlSchemaCloneWildcardNsConstraints(ctxt, completeWild, curWild) == -1)
	    return(-1);
	return(0);
    }
    /*
    * 3 If either O1 or O2 is a pair of not and a value (a namespace
    * name or `absent`) and the other is a set of (namespace names or
    * `absent`), then that set, minus the negated value if it was in
    * the set, minus `absent` if it was in the set, must be the value.
    */
    if (((completeWild->negNsSet != NULL) && (curWild->nsSet != NULL)) ||
	((curWild->negNsSet != NULL) && (completeWild->nsSet != NULL))) {
	const xmlChar *neg;

	if (completeWild->nsSet == NULL) {
	    neg = completeWild->negNsSet->value;
	    if (xmlSchemaCloneWildcardNsConstraints(ctxt, completeWild, curWild) == -1)
		return(-1);
	} else
	    neg = curWild->negNsSet->value;
	/*
	* Remove absent and negated.
	*/
	prev = NULL;
	cur = completeWild->nsSet;
	while (cur != NULL) {
	    if (cur->value == NULL) {
		if (prev == NULL)
		    completeWild->nsSet = cur->next;
		else
		    prev->next = cur->next;
		xmlFree(cur);
		break;
	    }
	    prev = cur;
	    cur = cur->next;
	}
	if (neg != NULL) {
	    prev = NULL;
	    cur = completeWild->nsSet;
	    while (cur != NULL) {
		if (cur->value == neg) {
		    if (prev == NULL)
			completeWild->nsSet = cur->next;
		    else
			prev->next = cur->next;
		    xmlFree(cur);
		    break;
		}
		prev = cur;
		cur = cur->next;
	    }
	}

	return(0);
    }
    /*
    * 4 If both O1 and O2 are sets of (namespace names or `absent`),
    * then the intersection of those sets must be the value.
    */
    if ((completeWild->nsSet != NULL) && (curWild->nsSet != NULL)) {
	int found;

	cur = completeWild->nsSet;
	prev = NULL;
	while (cur != NULL) {
	    found = 0;
	    curB = curWild->nsSet;
	    while (curB != NULL) {
		if (cur->value == curB->value) {
		    found = 1;
		    break;
		}
		curB = curB->next;
	    }
	    if (!found) {
		if (prev == NULL)
		    completeWild->nsSet = cur->next;
		else
		    prev->next = cur->next;
		tmp = cur->next;
		xmlFree(cur);
		cur = tmp;
		continue;
	    }
	    prev = cur;
	    cur = cur->next;
	}

	return(0);
    }
    /* 5 If the two are negations of different namespace names,
    * then the intersection is not expressible
    */
    if ((completeWild->negNsSet != NULL) &&
	(curWild->negNsSet != NULL) &&
	(completeWild->negNsSet->value != curWild->negNsSet->value) &&
	(completeWild->negNsSet->value != NULL) &&
	(curWild->negNsSet->value != NULL)) {

	xmlSchemaPErr(ctxt, completeWild->node, XML_SCHEMAP_INTERSECTION_NOT_EXPRESSIBLE,
	    "The intersection of the wildcard is not expressible.\n",
	    NULL, NULL);
	return(XML_SCHEMAP_INTERSECTION_NOT_EXPRESSIBLE);
    }
    /*
    * 6 If the one is a negation of a namespace name and the other
    * is a negation of `absent`, then the one which is the negation
    * of a namespace name must be the value.
    */
    if ((completeWild->negNsSet != NULL) && (curWild->negNsSet != NULL) &&
	(completeWild->negNsSet->value != curWild->negNsSet->value) &&
	(completeWild->negNsSet->value == NULL)) {
	completeWild->negNsSet->value =  curWild->negNsSet->value;
    }
    return(0);
}